

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O0

Sfm_Lib_t * Sfm_LibPrepare(int nVars,int fTwo,int fDelay,int fVerbose,int fLibVerbose)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  abctime aVar8;
  Sfm_Lib_t *p_00;
  Mio_Cell2_t *pMVar9;
  int *piVar10;
  abctime aVar11;
  int t_1;
  int nFanins_1;
  int t;
  int nFanins;
  word uTruth;
  char pRes [1000];
  word local_148;
  word tCur [4];
  word tTemp1 [4];
  int local_100;
  int n;
  int f;
  int i;
  int nPerms [9];
  int local_c8 [2];
  int Perm [8];
  int *Perm2;
  int *Perm1;
  int *pPerm [9];
  Mio_Cell2_t *pLimit;
  Mio_Cell2_t *pCell2;
  Mio_Cell2_t *pCell1;
  Sfm_Lib_t *p;
  abctime clk;
  int fLibVerbose_local;
  int fVerbose_local;
  int fDelay_local;
  int fTwo_local;
  int nVars_local;
  
  aVar8 = Abc_Clock();
  p_00 = Sfm_LibStart(nVars,fDelay,fLibVerbose);
  if (8 < nVars) {
    __assert_fail("nVars <= SFM_SUPP_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmLib.c"
                  ,0x1b2,"Sfm_Lib_t *Sfm_LibPrepare(int, int, int, int, int)");
  }
  iVar4 = Abc_MinInt(6,nVars);
  pMVar9 = Mio_CollectRootsNewDefault2(iVar4,&p_00->nCells,0);
  p_00->pCells = pMVar9;
  pMVar9 = p_00->pCells + p_00->nCells;
  for (pCell2 = p_00->pCells + 4; pCell2 < pMVar9; pCell2 = pCell2 + 1) {
    _t = pCell2->uTruth;
    *(uint *)&pCell2->field_0x10 = *(uint *)&pCell2->field_0x10 & 0xf3ffffff;
    iVar4 = Abc_Tt6IsAndType(_t,*(uint *)&pCell2->field_0x10 >> 0x1c);
    if ((iVar4 == 0) &&
       (iVar4 = Abc_Tt6IsOrType(_t,*(uint *)&pCell2->field_0x10 >> 0x1c), iVar4 == 0)) {
      iVar4 = Dau_DsdDecompose((word *)&t,*(uint *)&pCell2->field_0x10 >> 0x1c,0,0,(char *)&uTruth);
      if (iVar4 < 4) {
        *(uint *)&pCell2->field_0x10 = *(uint *)&pCell2->field_0x10 & 0xf3ffffff | 0x8000000;
      }
      else if (fLibVerbose != 0) {
        printf("Skipping gate \"%s\" with non-DSD function %s\n",pCell2->pName,&uTruth);
      }
    }
    else {
      *(uint *)&pCell2->field_0x10 = *(uint *)&pCell2->field_0x10 & 0xf3ffffff | 0x4000000;
    }
  }
  for (n = 2; n <= nVars; n = n + 1) {
    piVar10 = Extra_PermSchedule(n);
    pPerm[(long)n + -1] = piVar10;
  }
  for (n = 2; n <= nVars; n = n + 1) {
    iVar4 = Extra_Factorial(n);
    (&f)[n] = iVar4;
  }
  for (pCell2 = p_00->pCells + 4; pCell2 < pMVar9; pCell2 = pCell2 + 1) {
    uVar5 = *(uint *)&pCell2->field_0x10 >> 0x1c;
    if ((uVar5 < 2) || (nVars < (int)uVar5)) {
      __assert_fail("nFanins >= 2 && nFanins <= nVars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmLib.c"
                    ,0x1cb,"Sfm_Lib_t *Sfm_LibPrepare(int, int, int, int, int)");
    }
    for (n = 0; n < (int)uVar5; n = n + 1) {
      local_c8[n] = n;
    }
    local_148 = pCell2->uTruth;
    if (6 < p_00->nVars) {
      tCur[0] = local_148;
      tCur[1] = local_148;
      tCur[2] = local_148;
    }
    tCur[3] = local_148;
    for (tTemp1[3]._4_4_ = 0; tTemp1[3]._4_4_ < (&f)[(int)uVar5];
        tTemp1[3]._4_4_ = tTemp1[3]._4_4_ + 1) {
      Sfm_LibPrepareAdd(p_00,&local_148,local_c8,uVar5,pCell2,(Mio_Cell2_t *)0x0,-1);
      Abc_TtSwapAdjacent(&local_148,p_00->nWords,pPerm[(long)(int)uVar5 + -1][tTemp1[3]._4_4_]);
      Perm._24_8_ = Perm + (long)pPerm[(long)(int)uVar5 + -1][tTemp1[3]._4_4_] + -1;
      iVar4 = local_c8[pPerm[(long)(int)uVar5 + -1][tTemp1[3]._4_4_]];
      local_c8[pPerm[(long)(int)uVar5 + -1][tTemp1[3]._4_4_]] =
           Perm[(long)pPerm[(long)(int)uVar5 + -1][tTemp1[3]._4_4_] + -1];
      *(int *)Perm._24_8_ = iVar4;
    }
    iVar4 = Abc_TtEqual(tCur + 3,&local_148,p_00->nWords);
    if (iVar4 == 0) {
      __assert_fail("Abc_TtEqual(tTemp1, tCur, p->nWords)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmLib.c"
                    ,0x1db,"Sfm_Lib_t *Sfm_LibPrepare(int, int, int, int, int)");
    }
  }
  if (fTwo != 0) {
    for (pCell2 = p_00->pCells + 4; pCell2 < pMVar9; pCell2 = pCell2 + 1) {
      if ((*(uint *)&pCell2->field_0x10 >> 0x1a & 3) != 0) {
        for (pLimit = p_00->pCells + 4; pLimit < pMVar9; pLimit = pLimit + 1) {
          if (((*(uint *)&pLimit->field_0x10 >> 0x1a & 3) != 0) &&
             ((int)((*(uint *)&pCell2->field_0x10 >> 0x1c) + (*(uint *)&pLimit->field_0x10 >> 0x1c))
              <= nVars + 1)) {
            for (local_100 = 0; local_100 < (int)(*(uint *)&pLimit->field_0x10 >> 0x1c);
                local_100 = local_100 + 1) {
              iVar4 = (*(uint *)&pCell2->field_0x10 >> 0x1c) +
                      (*(uint *)&pLimit->field_0x10 >> 0x1c) + -1;
              if ((iVar4 < 2) || (nVars < iVar4)) {
                __assert_fail("nFanins >= 2 && nFanins <= nVars",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmLib.c"
                              ,0x1e7,"Sfm_Lib_t *Sfm_LibPrepare(int, int, int, int, int)");
              }
              for (n = 0; n < iVar4; n = n + 1) {
                local_c8[n] = n;
              }
              if (p_00->nVars < 7) {
                local_148 = Sfm_LibTruth6Two(pCell2,pLimit,local_100);
                tCur[3] = local_148;
              }
              else {
                Sfm_LibTruth8Two(pCell2,pLimit,local_100,&local_148);
                Abc_TtCopy(tCur + 3,&local_148,p_00->nWords,0);
              }
              tTemp1[3]._4_4_ = 0;
              while ((tTemp1[3]._4_4_ < (&f)[iVar4] &&
                     (Sfm_LibPrepareAdd(p_00,&local_148,local_c8,iVar4,pCell2,pLimit,local_100),
                     iVar4 < 6))) {
                Abc_TtSwapAdjacent(&local_148,p_00->nWords,pPerm[(long)iVar4 + -1][tTemp1[3]._4_4_])
                ;
                Perm._24_8_ = Perm + (long)pPerm[(long)iVar4 + -1][tTemp1[3]._4_4_] + -1;
                iVar1 = local_c8[pPerm[(long)iVar4 + -1][tTemp1[3]._4_4_]];
                local_c8[pPerm[(long)iVar4 + -1][tTemp1[3]._4_4_]] =
                     Perm[(long)pPerm[(long)iVar4 + -1][tTemp1[3]._4_4_] + -1];
                *(int *)Perm._24_8_ = iVar1;
                tTemp1[3]._4_4_ = tTemp1[3]._4_4_ + 1;
              }
              iVar4 = Abc_TtEqual(tCur + 3,&local_148,p_00->nWords);
              if (iVar4 == 0) {
                __assert_fail("Abc_TtEqual(tTemp1, tCur, p->nWords)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmLib.c"
                              ,0x1fd,"Sfm_Lib_t *Sfm_LibPrepare(int, int, int, int, int)");
              }
            }
          }
        }
      }
    }
  }
  for (n = 2; n <= nVars; n = n + 1) {
    if (pPerm[(long)n + -1] != (int *)0x0) {
      free(pPerm[(long)n + -1]);
      pPerm[(long)n + -1] = (int *)0x0;
    }
  }
  if (fVerbose != 0) {
    uVar5 = p_00->nCells;
    iVar6 = Vec_MemEntryNum(p_00->vTtMem);
    iVar4 = p_00->nObjs;
    iVar1 = p_00->nObjRemoved;
    iVar2 = p_00->nObjs;
    iVar3 = p_00->nObjRemoved;
    iVar7 = Vec_MemEntryNum(p_00->vTtMem);
    printf("Library processing: Var = %d. Cell = %d.  Fun = %d. Obj = %d. Ave = %.2f.  Skip = %d. Rem = %d.  "
           ,((double)(iVar2 - iVar3) * 1.0) / (double)(iVar7 + -2),(ulong)(uint)nVars,(ulong)uVar5,
           (ulong)(iVar6 - 2),(ulong)(uint)(iVar4 - iVar1),(ulong)(uint)p_00->nObjSkipped,
           p_00->nObjRemoved);
    aVar11 = Abc_Clock();
    Abc_PrintTime(1,"Time",aVar11 - aVar8);
  }
  return p_00;
}

Assistant:

Sfm_Lib_t * Sfm_LibPrepare( int nVars, int fTwo, int fDelay, int fVerbose, int fLibVerbose )
{
    abctime clk = Abc_Clock();
    Sfm_Lib_t * p = Sfm_LibStart( nVars, fDelay, fLibVerbose );
    Mio_Cell2_t * pCell1, * pCell2, * pLimit;
    int * pPerm[SFM_SUPP_MAX+1], * Perm1, * Perm2, Perm[SFM_SUPP_MAX];
    int nPerms[SFM_SUPP_MAX+1], i, f, n;
    word tTemp1[4], tCur[4];
    char pRes[1000];
    assert( nVars <= SFM_SUPP_MAX );
    // precompute gates
    p->pCells = Mio_CollectRootsNewDefault2( Abc_MinInt(6, nVars), &p->nCells, 0 );
    pLimit = p->pCells + p->nCells;
    // find useful ones
    for ( pCell1 = p->pCells + 4; pCell1 < pLimit; pCell1++ )
    {
        word uTruth = pCell1->uTruth;
        pCell1->Type = 0;
        if ( Abc_Tt6IsAndType(uTruth, pCell1->nFanins) || Abc_Tt6IsOrType(uTruth, pCell1->nFanins) )
            pCell1->Type = 1;
        else if ( Dau_DsdDecompose(&uTruth, pCell1->nFanins, 0, 0, pRes) <= 3 )
            pCell1->Type = 2;
        else if ( fLibVerbose )
            printf( "Skipping gate \"%s\" with non-DSD function %s\n", pCell1->pName, pRes );
    }
    // generate permutations
    for ( i = 2; i <= nVars; i++ )
        pPerm[i] = Extra_PermSchedule( i );
    for ( i = 2; i <= nVars; i++ )
        nPerms[i] = Extra_Factorial( i );
    // add single cells
    for ( pCell1 = p->pCells + 4; pCell1 < pLimit; pCell1++ ) 
    {
        int nFanins = pCell1->nFanins;
        assert( nFanins >= 2 && nFanins <= nVars );
        for ( i = 0; i < nFanins; i++ )
            Perm[i] = i;
        // permute truth table
        tCur[0] = tTemp1[0] = pCell1->uTruth;
        if ( p->nVars > 6 )
            tTemp1[1] = tTemp1[2] = tTemp1[3] = tCur[1] = tCur[2] = tCur[3] = tCur[0];
        for ( n = 0; n < nPerms[nFanins]; n++ )
        {
            Sfm_LibPrepareAdd( p, tCur, Perm, nFanins, pCell1, NULL, -1 );
            // update
            Abc_TtSwapAdjacent( tCur, p->nWords, pPerm[nFanins][n] );
            Perm1 = Perm + pPerm[nFanins][n];
            Perm2 = Perm1 + 1;
            ABC_SWAP( int, *Perm1, *Perm2 );
        }
        assert( Abc_TtEqual(tTemp1, tCur, p->nWords) );
    }
    // add double cells
    if ( fTwo )
    for ( pCell1 = p->pCells + 4; pCell1 < pLimit; pCell1++ ) // Bot
    if ( pCell1->Type > 0 )
    for ( pCell2 = p->pCells + 4; pCell2 < pLimit; pCell2++ ) // Top
    if ( pCell2->Type > 0 )//&& pCell1->Type + pCell2->Type <= 2 )
    if ( (int)pCell1->nFanins + (int)pCell2->nFanins <= nVars + 1 )
    for ( f = 0; f < (int)pCell2->nFanins; f++ )
    {
        int nFanins = pCell1->nFanins + pCell2->nFanins - 1;
        assert( nFanins >= 2 && nFanins <= nVars );
        for ( i = 0; i < nFanins; i++ )
            Perm[i] = i;
        // permute truth table
        if ( p->nVars > 6 )
        {
            Sfm_LibTruth8Two( pCell1, pCell2, f, tCur );
            Abc_TtCopy( tTemp1, tCur, p->nWords, 0 );
        }
        else
            tCur[0] = tTemp1[0] = Sfm_LibTruth6Two( pCell1, pCell2, f );
        for ( n = 0; n < nPerms[nFanins]; n++ )
        {
            Sfm_LibPrepareAdd( p, tCur, Perm, nFanins, pCell1, pCell2, f );
            if ( nFanins > 5 )
                break;
            // update
            Abc_TtSwapAdjacent( tCur, p->nWords, pPerm[nFanins][n] );
            Perm1 = Perm + pPerm[nFanins][n];
            Perm2 = Perm1 + 1;
            ABC_SWAP( int, *Perm1, *Perm2 );
        }
        assert( Abc_TtEqual(tTemp1, tCur, p->nWords) );
    }
    // cleanup
    for ( i = 2; i <= nVars; i++ )
        ABC_FREE( pPerm[i] );
    if ( fVerbose )
    {
        printf( "Library processing: Var = %d. Cell = %d.  Fun = %d. Obj = %d. Ave = %.2f.  Skip = %d. Rem = %d.  ", 
            nVars, p->nCells, Vec_MemEntryNum(p->vTtMem)-2, 
            p->nObjs-p->nObjRemoved, 1.0*(p->nObjs-p->nObjRemoved)/(Vec_MemEntryNum(p->vTtMem)-2), 
            p->nObjSkipped, p->nObjRemoved );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
    return p;
}